

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O0

bool __thiscall BaseTest::testEqual(BaseTest *this)

{
  bool bVar1;
  reference pvVar2;
  anon_class_1_0_00000001 *in_RDI;
  double a;
  int i;
  anon_class_1_0_00000001 deq;
  int local_18;
  
  local_18 = 1;
  while( true ) {
    if (*(int *)(in_RDI + 8) <= local_18) {
      return true;
    }
    pvVar2 = std::vector<BaseTest::Result,_std::allocator<BaseTest::Result>_>::operator[]
                       ((vector<BaseTest::Result,_std::allocator<BaseTest::Result>_> *)
                        (in_RDI + 0x10),(long)local_18);
    a = (double)pvVar2->time;
    std::vector<BaseTest::Result,_std::allocator<BaseTest::Result>_>::operator[]
              ((vector<BaseTest::Result,_std::allocator<BaseTest::Result>_> *)(in_RDI + 0x10),0);
    bVar1 = testEqual::anon_class_1_0_00000001::operator()(in_RDI,a,5.32167000317232e-318);
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

bool BaseTest::testEqual()
{
	auto deq = [](double a, double b)
	{ return std::abs(a - b) < 1e-3; };
	for (int i = 1; i < N; ++i)
		if (!deq(results[i].time, results[0].time))
			return false;
	return true;
}